

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::GeneratorContext::GetCompilerVersion
          (GeneratorContext *this,Version *version)

{
  uint32_t *puVar1;
  Arena *arena;
  Version *version_local;
  GeneratorContext *this_local;
  
  Version::set_major(version,6);
  Version::set_minor(version,0x1f);
  Version::set_patch(version,0);
  puVar1 = internal::HasBits<1>::operator[](&(version->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = MessageLite::GetArena((MessageLite *)version);
  internal::ArenaStringPtr::Set(&(version->field_0)._impl_.suffix_,"-dev",arena);
  return;
}

Assistant:

void GeneratorContext::GetCompilerVersion(Version* version) const {
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);
}